

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

Maybe<capnp::Schema> __thiscall
capnp::SchemaLoader::tryGet(SchemaLoader *this,uint64_t id,Reader brand,Schema scope)

{
  Reader proto;
  Waiter *this_00;
  long *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar1;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_02;
  RawSchema *schema;
  Maybe<capnp::Schema> MVar2;
  undefined1 local_98 [48];
  undefined1 local_68 [24];
  Disposer *local_50;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_48;
  
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockShared
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_98);
  Impl::tryGet((Impl *)(local_68 + 0x10),
               (uint64_t)*(Maybe<kj::_::Mutex::Waiter_&> **)(local_98._8_8_ + 8));
  kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_98);
  if (((RawSchema *)local_68._16_8_ == (RawSchema *)0x0) ||
     (aVar1 = extraout_RDX, schema = (RawSchema *)local_68._16_8_,
     *(Initializer **)(local_68._16_8_ + 0x40) != (Initializer *)0x0)) {
    if (local_50 != (Disposer *)0x0) {
      (**local_50->_vptr_Disposer)(local_50,id,scope.raw);
    }
    kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockShared
              ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_68,id);
    Impl::tryGet((Impl *)local_98,(uint64_t)*(Maybe<kj::_::Mutex::Waiter_&> **)(local_68._8_8_ + 8))
    ;
    kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
              ((Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_68);
    aVar1 = extraout_RDX_00;
    schema = (RawSchema *)local_98._0_8_;
    if ((RawSchema *)local_98._0_8_ != (RawSchema *)0x0) goto LAB_00196f33;
  }
  else {
LAB_00196f33:
    if (schema->lazyInitializer == (Initializer *)0x0) {
      capnp::schema::Brand::Reader::getScopes((Reader *)local_98,&brand);
      if (local_98._24_4_ == 0) {
        *(undefined1 *)&(this->impl).mutex.futex = 1;
        (this->impl).mutex.waitersHead.ptr = (Waiter *)&schema->defaultBrand;
        aVar1 = extraout_RDX_01;
      }
      else {
        kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockExclusive
                  ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_98,id)
        ;
        if (((ArrayDisposer *)(ulong)*(uint *)(in_RCX + 3) == (ArrayDisposer *)0x0) &&
           ((long *)(*in_RCX + 0x48) != in_RCX)) {
          local_48.ptr.isSet = false;
        }
        else {
          local_48.ptr.field_1.value.ptr = (Scope *)in_RCX[1];
          local_48.ptr.isSet = true;
          local_48.ptr.field_1.value.size_ = (size_t)(ArrayDisposer *)(ulong)*(uint *)(in_RCX + 3);
        }
        proto._reader.capTable = brand._reader.capTable;
        proto._reader.segment = brand._reader.segment;
        proto._reader.data = brand._reader.data;
        proto._reader.pointers = brand._reader.pointers;
        proto._reader.dataSize = brand._reader.dataSize;
        proto._reader.pointerCount = brand._reader.pointerCount;
        proto._reader._38_2_ = brand._reader._38_2_;
        proto._reader.nestingLimit = brand._reader.nestingLimit;
        proto._reader._44_4_ = brand._reader._44_4_;
        this_00 = (Waiter *)Impl::makeBranded(*(Impl **)(local_98._8_8_ + 8),schema,proto,&local_48)
        ;
        kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
                  ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_98);
        _::RawBrandedSchema::ensureInitialized((RawBrandedSchema *)this_00);
        *(undefined1 *)&(this->impl).mutex.futex = 1;
        (this->impl).mutex.waitersHead.ptr = this_00;
        aVar1 = extraout_RDX_02;
      }
      goto LAB_00196f3e;
    }
  }
  *(undefined1 *)&(this->impl).mutex.futex = 0;
LAB_00196f3e:
  MVar2.ptr.field_1 = aVar1;
  MVar2.ptr._0_8_ = this;
  return (Maybe<capnp::Schema>)MVar2.ptr;
}

Assistant:

kj::Maybe<Schema> SchemaLoader::tryGet(
    uint64_t id, schema::Brand::Reader brand, Schema scope) const {
  auto getResult = impl.lockShared()->get()->tryGet(id);
  if (getResult.schema == nullptr || getResult.schema->lazyInitializer != nullptr) {
    // This schema couldn't be found or has yet to be lazily loaded. If we have a lazy loader
    // callback, invoke it now to try to get it to load this schema.
    KJ_IF_SOME(c, getResult.callback) {
      c.load(*this, id);
    }
    getResult = impl.lockShared()->get()->tryGet(id);
  }
  if (getResult.schema != nullptr && getResult.schema->lazyInitializer == nullptr) {
    if (brand.getScopes().size() > 0) {
      auto brandedSchema = impl.lockExclusive()->get()->makeBranded(
          getResult.schema, brand,
          scope.raw->isUnbound()
              ? kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>>(kj::none)
              : kj::arrayPtr(scope.raw->scopes, scope.raw->scopeCount));
      brandedSchema->ensureInitialized();
      return Schema(brandedSchema);
    } else {
      return Schema(&getResult.schema->defaultBrand);
    }
  } else {
    return kj::none;
  }
}